

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

bool anon_unknown.dwarf_c3752::IsLookupOnlyVariable(ExpressionContext *ctx,VariableData *variable)

{
  ScopeData *curr_1;
  ScopeData *pSVar1;
  FunctionData *pFVar2;
  VariableHandle *pVVar3;
  
  for (; (ctx != (ExpressionContext *)0x0 && ((ctx->uniqueDependencies).data == (ModuleData **)0x0))
      ; ctx = *(ExpressionContext **)ctx) {
    pFVar2 = (FunctionData *)ctx->moduleRoot;
    if (pFVar2 != (FunctionData *)0x0) goto LAB_00179084;
  }
  pFVar2 = (FunctionData *)0x0;
LAB_00179084:
  pSVar1 = variable->scope;
  if ((pSVar1 != (ScopeData *)0x0) && (pSVar1->type != SCOPE_TEMPORARY)) {
    do {
      if (pSVar1->ownerType != (TypeBase *)0x0) {
        return false;
      }
      if (pSVar1->ownerNamespace != (NamespaceData *)0x0) {
        return false;
      }
      if (pSVar1->ownerFunction != (FunctionData *)0x0) {
        if (pFVar2 == (FunctionData *)0x0) {
          return false;
        }
        if (pSVar1->ownerFunction == pFVar2) {
          if (pFVar2->coroutine != true) {
            return false;
          }
          pVVar3 = (pFVar2->argumentVariables).head;
          while( true ) {
            if (pVVar3 == (VariableHandle *)0x0) {
              if (pFVar2->contextArgument == variable) {
                return false;
              }
              return true;
            }
            if (pVVar3->variable == variable) break;
            pVVar3 = pVVar3->next;
          }
          return false;
        }
        return true;
      }
      pSVar1 = pSVar1->scope;
    } while (pSVar1 != (ScopeData *)0x0);
  }
  return false;
}

Assistant:

FunctionData* ExpressionContext::GetCurrentFunction(ScopeData *scopeData)
{
	// Walk up, but if we reach a type owner, stop - we're not in a context of a function
	for(ScopeData *curr = scopeData; curr; curr = curr->scope)
	{
		if(curr->ownerType)
			return NULL;

		if(FunctionData *function = curr->ownerFunction)
			return function;
	}

	return NULL;
}